

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall
GenericModelItem::insertRows(GenericModelItem *this,int row,QVector<GenericModelItem_*> *rows)

{
  int iVar1;
  qsizetype qVar2;
  reference ppGVar3;
  GenericModelItem **local_60;
  GenericModelItem **local_58;
  iterator local_50;
  iterator local_48;
  GenericModelItem **local_40;
  int local_34;
  int local_30;
  int maxI_1;
  int i_1;
  int maxI;
  int i;
  int count;
  QVector<GenericModelItem_*> *rows_local;
  GenericModelItem *pGStack_10;
  int row_local;
  GenericModelItem *this_local;
  
  _i = rows;
  rows_local._4_4_ = row;
  pGStack_10 = this;
  qVar2 = QList<GenericModelItem_*>::count(rows);
  maxI = (int)(qVar2 / (long)this->m_colCount);
  i_1 = rows_local._4_4_ * this->m_colCount;
  qVar2 = QList<GenericModelItem_*>::size(&this->children);
  maxI_1 = (int)qVar2;
  for (; iVar1 = maxI, i_1 < maxI_1; i_1 = i_1 + 1) {
    ppGVar3 = QList<GenericModelItem_*>::operator[](&this->children,(long)i_1);
    (*ppGVar3)->m_row = iVar1 + (*ppGVar3)->m_row;
  }
  local_30 = 0;
  qVar2 = QList<GenericModelItem_*>::size(rows);
  local_34 = (int)qVar2;
  for (; local_30 < local_34; local_30 = local_30 + 1) {
    ppGVar3 = QList<GenericModelItem_*>::operator[](rows,(long)local_30);
    (*ppGVar3)->parent = this;
    iVar1 = rows_local._4_4_ + local_30 / this->m_colCount;
    ppGVar3 = QList<GenericModelItem_*>::operator[](rows,(long)local_30);
    (*ppGVar3)->m_row = iVar1;
  }
  iVar1 = rows_local._4_4_ * this->m_colCount;
  qVar2 = QList<GenericModelItem_*>::size(rows);
  local_40 = (GenericModelItem **)
             QList<GenericModelItem_*>::insert
                       (&this->children,(long)iVar1,qVar2,(parameter_type)0x0);
  local_48 = QList<GenericModelItem_*>::begin(rows);
  local_50 = QList<GenericModelItem_*>::end(rows);
  local_60 = (GenericModelItem **)QList<GenericModelItem_*>::begin(&this->children);
  local_58 = (GenericModelItem **)
             QList<GenericModelItem*>::iterator::operator+
                       ((iterator *)&local_60,rows_local._4_4_ * this->m_colCount);
  std::copy<QList<GenericModelItem*>::iterator,QList<GenericModelItem*>::iterator>
            (local_48,local_50,(iterator)local_58);
  this->m_rowCount = maxI + this->m_rowCount;
  return;
}

Assistant:

void GenericModelItem::insertRows(int row, QVector<GenericModelItem *> rows)
{
    Q_ASSERT(row >= 0 && row <= m_rowCount);
    Q_ASSERT(!rows.isEmpty());
    Q_ASSERT(rows.count() % m_colCount == 0);
    const int count = rows.count() / m_colCount;
    for (int i = row * m_colCount, maxI = children.size(); i < maxI; ++i)
        children[i]->m_row += count;
    for (int i = 0, maxI = rows.size(); i < maxI; ++i) {
        rows[i]->parent = this;
        rows[i]->m_row = row + (i / m_colCount);
    }
    children.insert(row * m_colCount, rows.size(), nullptr);
    std::copy(rows.begin(), rows.end(), children.begin() + (row * m_colCount));
    m_rowCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    Q_ASSERT(std::all_of(children.constBegin(), children.constEnd(), [](GenericModelItem *item) -> bool { return item != nullptr; }));
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}